

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
vkt::(anonymous_namespace)::generateVertexSpecialization_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          ProgramSpecializationParams *specParams)

{
  Value *pVVar1;
  Value *pVVar2;
  ostream *poVar3;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var4;
  allocator<char> local_499;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_478;
  _Base_ptr local_438;
  undefined1 local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_408;
  _Base_ptr local_3c8;
  undefined1 local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  int local_354;
  char *pcStack_350;
  int numLocs;
  char *transportTypeStr;
  char *pcStack_340;
  DataType transportType;
  char *valueTypeStr;
  const_reference pvStack_330;
  DataType valueType;
  Value *val;
  size_t ndx;
  undefined1 local_315;
  int curInputLoc;
  ostringstream local_308 [8];
  ostringstream setup;
  ostringstream local_190 [8];
  ostringstream decl;
  ProgramSpecializationParams *specParams_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *params;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_308);
  local_315 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  ndx._4_4_ = 0;
  std::operator<<((ostream *)local_190,"layout(location = 0) in highp vec4 dEQP_Position;\n");
  ndx._4_4_ = ndx._4_4_ + 1;
  for (val = (Value *)0x0; pVVar1 = val,
      pVVar2 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                  ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                                   (*(long *)this + 0x30)), pVVar1 < pVVar2;
      val = (Value *)((long)&(val->type).m_type + 1)) {
    pvStack_330 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                            ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                             (*(long *)this + 0x30),(size_type)val);
    valueTypeStr._4_4_ = glu::VarType::getBasicType(&pvStack_330->type);
    pcStack_340 = glu::getDataTypeName(valueTypeStr._4_4_);
    transportTypeStr._4_4_ = vkt::anon_unknown_0::getTransportType(valueTypeStr._4_4_);
    pcStack_350 = glu::getDataTypeName(transportTypeStr._4_4_);
    local_354 = vkt::anon_unknown_0::getNumTransportLocations(valueTypeStr._4_4_);
    poVar3 = std::operator<<((ostream *)local_190,"layout(location = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,ndx._4_4_);
    std::operator<<(poVar3,") in ");
    ndx._4_4_ = local_354 + ndx._4_4_;
    if (valueTypeStr._4_4_ == transportTypeStr._4_4_) {
      poVar3 = std::operator<<((ostream *)local_190,pcStack_350);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,(string *)&pvStack_330->name);
      std::operator<<(poVar3,";\n");
    }
    else {
      poVar3 = std::operator<<((ostream *)local_190,pcStack_350);
      poVar3 = std::operator<<(poVar3," a_");
      poVar3 = std::operator<<(poVar3,(string *)&pvStack_330->name);
      std::operator<<(poVar3,";\n");
      poVar3 = std::operator<<((ostream *)local_308,pcStack_340);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,(string *)&pvStack_330->name);
      poVar3 = std::operator<<(poVar3," = ");
      poVar3 = std::operator<<(poVar3,pcStack_340);
      poVar3 = std::operator<<(poVar3,"(a_");
      poVar3 = std::operator<<(poVar3,(string *)&pvStack_330->name);
      std::operator<<(poVar3,");\n");
    }
  }
  vkt::anon_unknown_0::declareUniforms
            ((ostringstream *)local_190,(ValueBlock *)(*(long *)this + 0x30));
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_398,(char (*) [20])"VERTEX_DECLARATIONS",&local_3b8);
  _Var4 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)__return_storage_ptr__,&local_398);
  local_3c8 = (_Base_ptr)_Var4.first._M_node;
  local_3c0 = _Var4.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_408,(char (*) [13])"VERTEX_SETUP",&local_428);
  _Var4 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)__return_storage_ptr__,&local_408);
  local_438 = (_Base_ptr)_Var4.first._M_node;
  local_430 = _Var4.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"gl_Position = dEQP_Position;\n",&local_499);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_478,(char (*) [14])"VERTEX_OUTPUT",&local_498);
  std::
  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)__return_storage_ptr__,&local_478);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  local_315 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_308);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

map<string, string> generateVertexSpecialization (const ProgramSpecializationParams& specParams)
{
	ostringstream			decl;
	ostringstream			setup;
	map<string, string>		params;
	int						curInputLoc		= 0;

	decl << "layout(location = 0) in highp vec4 dEQP_Position;\n";
	curInputLoc += 1;

	for (size_t ndx = 0; ndx < specParams.caseSpec.values.inputs.size(); ndx++)
	{
		const Value&		val					= specParams.caseSpec.values.inputs[ndx];
		const DataType		valueType			= val.type.getBasicType();
		const char*	const	valueTypeStr		= getDataTypeName(valueType);
		const DataType		transportType		= getTransportType(valueType);
		const char* const	transportTypeStr	= getDataTypeName(transportType);
		const int			numLocs				= getNumTransportLocations(valueType);

		decl << "layout(location = " << curInputLoc << ") in ";

		curInputLoc += numLocs;

		if (valueType == transportType)
			decl << transportTypeStr << " " << val.name << ";\n";
		else
		{
			decl << transportTypeStr << " a_" << val.name << ";\n";
			setup << valueTypeStr << " " << val.name << " = " << valueTypeStr << "(a_" << val.name << ");\n";
		}
	}

	declareUniforms(decl, specParams.caseSpec.values);

	params.insert(pair<string, string>("VERTEX_DECLARATIONS",	decl.str()));
	params.insert(pair<string, string>("VERTEX_SETUP",			setup.str()));
	params.insert(pair<string, string>("VERTEX_OUTPUT",			string("gl_Position = dEQP_Position;\n")));

	return params;
}